

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execMul<(moira::Instr)81,(moira::Mode)11,(moira::Size)2>(Moira *this,u16 opcode)

{
  ushort uVar1;
  u32 uVar2;
  ulong uVar3;
  
  uVar1 = (this->queue).irc;
  readExt(this);
  uVar3 = (ulong)(opcode >> 9 & 7);
  uVar2 = (this->reg).pc;
  (this->reg).pc0 = uVar2;
  (this->queue).ird = (this->queue).irc;
  uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar2 + 2);
  (this->queue).irc = (u16)uVar2;
  uVar2 = mul<(moira::Instr)81>
                    (this,(uint)uVar1,(uint)*(ushort *)((long)this->exec + uVar3 * 4 + -0x58));
  *(u32 *)((long)this->exec + uVar3 * 4 + -0x58) = uVar2;
  return;
}

Assistant:

void
Moira::execMul(u16 opcode)
{
    if (MIMIC_MUSASHI) {
        execMulMusashi<I, M, S>(opcode);
        return;
    }

    u32 ea, data, result;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp <M,Word, STD_AE_FRAME> (src, ea, data)) return;

    prefetch<POLLIPL>();
    result = mul<I>(data, readD<Word>(dst));
    
    writeD(dst, result);
}